

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::tree_node<int,_false>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<int,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<int,_false>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  undefined4 *__s;
  ref<immutable::rrb_details::rrb_size_table<false>_> *__dest;
  int *piVar1;
  internal_node<int,_false> *p_node;
  rrb_size_table<false> *prVar2;
  uint32_t *puVar3;
  ref<immutable::rrb_details::internal_node<int,_false>_> rVar4;
  undefined4 *__ptr;
  internal_node<int,_false> *piVar5;
  uint32_t uVar6;
  ulong uVar7;
  char *__function;
  uint uVar8;
  tree_node<int,_false> *ptVar9;
  ulong uVar10;
  undefined4 in_register_00000084;
  long lVar11;
  uint uVar12;
  ref<immutable::rrb_details::internal_node<int,_false>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<int,_false>_> left_hand_node;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  size_t local_80;
  undefined8 local_78;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_70;
  uint32_t local_64;
  tree_node<int,_false> *local_60;
  uint32_t *local_58;
  rrb_size_table<false> *local_50;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_48;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_40;
  ref<immutable::rrb_details::rrb_size_table<false>_> *local_38;
  
  local_78 = CONCAT44(in_register_00000084,shift);
  uVar12 = left >> ((byte)shift & 0x1f);
  p_node = (internal_node<int,_false> *)root->ptr;
  local_60 = (tree_node<int,_false> *)this;
  local_58 = total_shift;
  if (shift == 0) {
    if (p_node != (internal_node<int,_false> *)0x0) {
      p_node->_ref_count = p_node->_ref_count + 1;
      uVar6 = p_node->len;
      __ptr = (undefined4 *)malloc((ulong)(uVar6 - uVar12) * 4 + 0x18);
      __s = __ptr + 6;
      uVar8 = uVar6 - uVar12;
      __ptr[1] = uVar8;
      *__ptr = 0;
      *(undefined4 **)(__ptr + 4) = __s;
      __ptr[3] = 0;
      if (uVar8 != 0) {
        memset(__s,0,(ulong)(uVar6 - uVar12) << 2);
      }
      ptVar9 = local_60;
      __ptr[2] = 1;
      if (uVar6 != uVar12) {
        prVar2 = (p_node->size_table).ptr;
        uVar10 = 0;
        do {
          __s[uVar10] = *(undefined4 *)((long)&prVar2->size + (ulong)(uVar12 + (int)uVar10) * 4);
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      *local_58 = 0;
      *(undefined4 **)local_60 = __ptr;
      if (__ptr[2] == 0) {
        free(__ptr);
      }
      uVar6 = p_node->_ref_count;
      p_node->_ref_count = uVar6 - 1;
      if (uVar6 != 1) {
        return (ref<immutable::rrb_details::tree_node<int,_false>_>)ptVar9;
      }
      free(p_node);
      return (ref<immutable::rrb_details::tree_node<int,_false>_>)ptVar9;
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
    ;
    goto LAB_0014d8dc;
  }
  if (p_node != (internal_node<int,_false> *)0x0) {
    p_node->_ref_count = p_node->_ref_count + 1;
    prVar2 = (p_node->size_table).ptr;
    if (prVar2 == (rrb_size_table<false> *)0x0) {
      uVar6 = left - (uVar12 << ((byte)shift & 0x1f));
    }
    else {
      puVar3 = prVar2->size;
      uVar10 = (ulong)(uVar12 - 1);
      do {
        uVar7 = uVar10;
        uVar12 = (int)uVar7 + 1;
        uVar10 = (ulong)uVar12;
      } while (puVar3[uVar12] <= left);
      uVar6 = left;
      if (uVar12 != 0) {
        uVar6 = left - puVar3[uVar7];
      }
    }
    uVar8 = p_node->len - 1;
    local_40.ptr = (tree_node<int,_false> *)p_node->child[uVar12].ptr;
    if ((internal_node<int,_false> *)local_40.ptr != (internal_node<int,_false> *)0x0) {
      ((internal_node<int,_false> *)local_40.ptr)->_ref_count =
           ((internal_node<int,_false> *)local_40.ptr)->_ref_count + 1;
    }
    rrb_drop_left_rec<int,false,6>
              ((rrb_details *)&local_70,total_shift,&local_40,uVar6,shift - 6,
               uVar12 != uVar8 || has_right);
    if (uVar12 != uVar8) {
      local_64 = p_node->len;
      uVar8 = local_64 - uVar12;
      uVar10 = (ulong)uVar8;
      local_80 = uVar10 * 8;
      piVar5 = (internal_node<int,_false> *)malloc(uVar10 * 8 + 0x20);
      piVar5->len = uVar8;
      piVar5->type = INTERNAL_NODE;
      local_38 = &piVar5->size_table;
      (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar5->guid = 0;
      piVar5->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar5 + 1);
      memset(piVar5 + 1,0,local_80);
      piVar5->_ref_count = 1;
      local_80 = (ulong)uVar12;
      for (lVar11 = 0; uVar12 = uVar12 + 1, (ulong)(uVar8 - 1) << 3 != lVar11; lVar11 = lVar11 + 8)
      {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar5->child[1].ptr + lVar11),p_node->child + uVar12);
      }
      prVar2 = (p_node->size_table).ptr;
      if (prVar2 != (rrb_size_table<false> *)0x0) {
        prVar2->_ref_count = prVar2->_ref_count + 1;
      }
      local_88.ptr = (internal_node<int,_false> *)malloc(uVar10 * 4 + 0x10);
      ptVar9 = local_60;
      __dest = &(local_88.ptr)->size_table;
      *(ref<immutable::rrb_details::rrb_size_table<false>_> **)local_88.ptr = __dest;
      (local_88.ptr)->guid = 0;
      (local_88.ptr)->_ref_count = 1;
      uVar6 = (uint32_t)local_78;
      local_50 = prVar2;
      if (prVar2 == (rrb_size_table<false> *)0x0) {
        if (local_64 != (uint32_t)local_80) {
          uVar7 = 0;
          do {
            *(uint32_t *)((long)&__dest->ptr + uVar7 * 4) =
                 (uint32_t)local_80 + 1 + (int)uVar7 << ((byte)local_78 & 0x1f);
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
      }
      else {
        memcpy(__dest,prVar2->size + local_80,uVar10 * 4);
      }
      if (local_64 != (uint32_t)local_80) {
        if (local_88.ptr == (internal_node<int,_false> *)0x0) {
LAB_0014d8c7:
          __function = 
          "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
          ;
          goto LAB_0014d8dc;
        }
        lVar11 = *(long *)local_88.ptr;
        uVar7 = 0;
        do {
          piVar1 = (int *)(lVar11 + uVar7 * 4);
          *piVar1 = *piVar1 - left;
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (local_38,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_88);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar5->child,&local_70);
      *local_58 = uVar6;
      piVar5->_ref_count = piVar5->_ref_count + 1;
      *(internal_node<int,_false> **)ptVar9 = piVar5;
      if ((local_88.ptr != (internal_node<int,_false> *)0x0) &&
         (uVar6 = (local_88.ptr)->_ref_count, (local_88.ptr)->_ref_count = uVar6 - 1, uVar6 == 1)) {
        free(local_88.ptr);
      }
      if ((local_50 != (rrb_size_table<false> *)0x0) &&
         (uVar6 = local_50->_ref_count, local_50->_ref_count = uVar6 - 1, uVar6 == 1)) {
        free(local_50);
      }
      release<int>(piVar5);
      goto LAB_0014d86b;
    }
    if (!has_right) {
      *(tree_node<int,_false> **)local_60 = local_70.ptr;
      ptVar9 = local_60;
      if ((internal_node<int,_false> *)local_70.ptr != (internal_node<int,_false> *)0x0) {
        (local_70.ptr)->_ref_count = (local_70.ptr)->_ref_count + 1;
      }
      goto LAB_0014d86b;
    }
    piVar5 = (internal_node<int,_false> *)malloc(0x28);
    piVar5->type = INTERNAL_NODE;
    piVar5->len = 1;
    (piVar5->size_table).ptr = (rrb_size_table<false> *)0x0;
    piVar5->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar5 + 1);
    piVar5[1].type = LEAF_NODE;
    piVar5[1].len = 0;
    piVar5->_ref_count = 1;
    piVar5->guid = 0;
    local_88.ptr = (internal_node<int,_false> *)local_70.ptr;
    if ((internal_node<int,_false> *)local_70.ptr != (internal_node<int,_false> *)0x0) {
      (local_70.ptr)->_ref_count = (local_70.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(piVar5->child,&local_88);
    rVar4.ptr = local_88.ptr;
    if (shift - 6 != 0) {
      if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014d899;
      if (((local_88.ptr)->size_table).ptr != (rrb_size_table<false> *)0x0) {
        local_48.ptr = (rrb_size_table<false> *)malloc(0x14);
        (local_48.ptr)->size = (uint32_t *)(local_48.ptr + 1);
        (local_48.ptr)->guid = 0;
        (local_48.ptr)->_ref_count = 1;
        prVar2 = ((rVar4.ptr)->size_table).ptr;
        if (prVar2 == (rrb_size_table<false> *)0x0) goto LAB_0014d8c7;
        *(uint32_t *)&local_48.ptr[1].size = prVar2->size[(rVar4.ptr)->len - 1];
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar5->size_table,&local_48);
        if ((local_48.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar6 = (local_48.ptr)->_ref_count, (local_48.ptr)->_ref_count = uVar6 - 1, uVar6 == 1))
        {
          free(local_48.ptr);
        }
      }
    }
    ptVar9 = local_60;
    *local_58 = (uint32_t)local_78;
    *(internal_node<int,_false> **)local_60 = piVar5;
    piVar5->_ref_count = piVar5->_ref_count + 1;
    release<int>(local_88.ptr);
    release<int>(piVar5);
LAB_0014d86b:
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_70);
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_40);
    release<int>(p_node);
    return (ref<immutable::rrb_details::tree_node<int,_false>_>)ptVar9;
  }
LAB_0014d899:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
  ;
LAB_0014d8dc:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }